

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_conv.cpp
# Opt level: O2

MatrixXd * __thiscall
LayerConv::img2mat(MatrixXd *__return_storage_ptr__,LayerConv *this,ImageVolume *input,
                  LayerSize *output_size,size_t f,int p,int s)

{
  pointer pvVar1;
  pointer pMVar2;
  long blockRows;
  long blockCols;
  pointer pvVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long cols;
  long lVar7;
  long startCol;
  long local_118;
  long local_108;
  MatrixXd v;
  MatrixXd channel_pad;
  ConstantReturnType local_68 [2];
  
  cols = f * f;
  pvVar3 = (input->
           super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (input->
           super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = *(long *)&(pvVar3->
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    )._M_impl.super__Vector_impl_data;
  pMVar2 = *(pointer *)
            ((long)&(pvVar3->
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    )._M_impl.super__Vector_impl_data + 8);
  blockRows = *(long *)(lVar4 + 8);
  blockCols = *(long *)(lVar4 + 0x10);
  lVar7 = output_size->rows * output_size->cols;
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant
            (local_68,blockRows + p * 2,p * 2 + blockCols,(Scalar *)&v);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&channel_pad,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_68);
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant
            (local_68,(((long)pvVar1 - (long)pvVar3) / 0x18) * lVar7,
             (((long)pMVar2 - lVar4) / 0x18) * cols,(Scalar *)&v);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_68);
  pvVar3 = (input->
           super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_108 = 0;
  for (uVar6 = 0;
      uVar6 < (ulong)(((long)(input->
                             super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18);
      uVar6 = uVar6 + 1) {
    uVar5 = 0;
    while( true ) {
      if ((ulong)(((long)*(pointer *)
                          ((long)&(pvVar3->
                                  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                  )._M_impl.super__Vector_impl_data + 8) -
                  *(long *)&(pvVar3->
                            super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                            )._M_impl.super__Vector_impl_data) / 0x18) <= uVar5) break;
      lVar4 = *(long *)&pvVar3[uVar6].
                        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        ._M_impl;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_68,
                 &channel_pad,(long)p,(long)p,blockRows,blockCols);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_68,
                 (Matrix<double,__1,__1,_0,__1,__1> *)(lVar4 + uVar5 * 0x18));
      local_118 = 0;
      for (lVar4 = 0; lVar4 < output_size->rows; lVar4 = lVar4 + s) {
        local_118 = (long)(int)local_118;
        for (startCol = 0; startCol < output_size->cols; startCol = startCol + s) {
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_68,
                     &channel_pad,lVar4,startCol,f,f);
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&v,
                     (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                      *)local_68);
          Eigen::internal::
          inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false,_false>::run
                    ((Matrix<double,__1,__1,_0,__1,__1> *)&v);
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&v,1,cols);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_68,
                     __return_storage_ptr__,local_108 + local_118,cols * uVar5,1,cols);
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_68,
                     (Matrix<double,__1,__1,_0,__1,__1> *)&v);
          free(v.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
          local_118 = local_118 + 1;
        }
      }
      uVar5 = uVar5 + 1;
      pvVar3 = (input->
               super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    local_108 = local_108 + lVar7;
  }
  free(channel_pad.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      );
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd LayerConv::img2mat(const ImageVolume& input, const LayerSize& output_size, size_t f, int p, int s) {
	auto f_size = f * f; // filter total size.
	auto rows = input[0][0].rows();
	auto cols = input[0][0].cols();
	auto conv_size = output_size.rows * output_size.cols;
	auto rows_input_mat = conv_size * input.size();
	auto cols_input_mat = input[0].size() * f_size;
	MatrixXd channel_pad = MatrixXd::Constant(rows + 2 * p, cols + 2 * p, 0);
	MatrixXd input_mat = MatrixXd::Constant(rows_input_mat, cols_input_mat, 0);
	for (auto img_ind = 0; img_ind < input.size(); img_ind++) {
		for (auto c = 0; c < input[0].size(); c++) {
			auto& channel = input[img_ind][c];
			channel_pad.block(p, p, rows, cols) = channel;
			for (int i = 0, row = 0; i < output_size.rows; i += s) {
				for (int j = 0; j < output_size.cols; j += s, row++) {
					MatrixXd v = channel_pad.block(i, j, f, f);
					v.transposeInPlace();
					v.resize(1, f_size);
					input_mat.block(img_ind * conv_size + row, c * f_size, 1, f_size) = v;
				}
			}
		}
	}

	return input_mat;
}